

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O3

entry * __thiscall libtorrent::entry::find_key(entry *this,string_view key)

{
  variant_alternative_t<3UL,_variant<long,_basic_string<char>,_vector<entry,_allocator<entry>_>,_map<basic_string<char>,_entry,_strview_less,_void,_void>,_vector<char,_allocator<char>_>,_uninitialized_type>_>
  *pvVar1;
  node_ptr pcVar2;
  node_ptr *ppcVar3;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_20;
  const_node_ptr local_18;
  
  local_30._M_str = key._M_str;
  local_30._M_len = key._M_len;
  if (*(__index_type *)
       ((long)&(this->super_variant_type).
               super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
               .
               super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
               .
               super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
               .
               super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
               .
               super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
               .
               super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
       + 0x20) == '\x03') {
    pvVar1 = ::std::
             get<3ul,long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>
                       (&this->super_variant_type);
    local_20.traits_ =
         (bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
          *)&(pvVar1->
             super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
             ).
             super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
             .m_icont.
             super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
             .
             super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
             .
             super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
             .
             super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
    ;
    local_18 = (const_node_ptr)local_20.traits_;
    pcVar2 = boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
             find<std::basic_string_view<char,std::char_traits<char>>,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>>>>
                       (&local_18,&local_30,&local_20);
    if (*(__index_type *)
         ((long)&(this->super_variant_type).
                 super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
         + 0x20) == '\x03') {
      pvVar1 = ::std::
               get<3ul,long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>
                         (&this->super_variant_type);
      if (pcVar2 == (node_ptr)
                    &(pvVar1->
                     super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                     ).
                     super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                     .m_icont.
                     super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                     .
                     super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                     .
                     super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                     .
                     super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
         ) {
        ppcVar3 = (node_ptr *)0x0;
      }
      else {
        if (pcVar2 == (node_ptr)0x0) {
          __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                        "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                       );
        }
        ppcVar3 = &pcVar2[2].left_;
      }
      return (entry *)ppcVar3;
    }
  }
  anon_unknown_5::throw_error();
}

Assistant:

entry const* entry::find_key(string_view key) const
	{
#if ! defined _GLIBCXX_DEBUG
		auto const i = dict().find(key);
#else
		auto const i = dict().find(std::string(key));
#endif
		if (i == dict().end()) return nullptr;
		return &i->second;
	}